

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::color4f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *result)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  char c;
  float4 v;
  color4f value;
  char local_61;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type sStack_38;
  
  pcVar2 = (result->
           super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    (result->super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
    )._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    bVar5 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)&local_60);
    if (bVar5) {
      local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_60._M_dataplus._M_p;
      sStack_38 = local_60._M_string_length;
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>::
        _M_realloc_insert<tinyusdz::value::color4f_const&>
                  ((vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>> *)
                   result,iVar3,(color4f *)&local_40);
      }
      else {
        *(pointer *)iVar3._M_current = local_60._M_dataplus._M_p;
        (iVar3._M_current)->b = (float)(undefined4)local_60._M_string_length;
        (iVar3._M_current)->a = (float)local_60._M_string_length._4_4_;
        ppcVar1 = &(result->
                   super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Not starting with the value of requested type.\n","");
      PushError(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_0043b141;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,&local_61);
        cVar7 = '\x01';
        if (bVar5) {
          if (local_61 == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,(char *)&local_60);
              cVar7 = ((char)local_60._M_dataplus._M_p == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if ((char)local_60._M_dataplus._M_p != end_symbol && bVar5) goto LAB_0043b0a7;
            }
          }
          else {
LAB_0043b0a7:
            if (local_61 == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                bVar5 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)&local_60);
                if (bVar5) {
                  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_60._M_dataplus._M_p;
                  sStack_38 = local_60._M_string_length;
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>
                    ::_M_realloc_insert<tinyusdz::value::color4f_const&>
                              ((vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>
                                *)result,iVar3,(color4f *)&local_40);
                  }
                  else {
                    *(pointer *)iVar3._M_current = local_60._M_dataplus._M_p;
                    (iVar3._M_current)->b = (float)(undefined4)local_60._M_string_length;
                    (iVar3._M_current)->a = (float)local_60._M_string_length._4_4_;
                    ppcVar1 = &(result->
                               super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppcVar1 = *ppcVar1 + 1;
                  }
                  cVar7 = '\0';
                }
                else {
                  cVar7 = '\x03';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_0043b141:
        if ((result->
            super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)
            ._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)
            ._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Empty array.\n","");
        PushError(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}